

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

void __thiscall Apt::UpdateAltitudes(Apt *this)

{
  bool bVar1;
  vector<RwyEndPt,_std::allocator<RwyEndPt>_> *in_RDI;
  pointer pRVar2;
  RwyEndPt *re;
  iterator __end1;
  iterator __begin1;
  vecRwyEndPtTy *__range1;
  XPLMProbeRef *in_stack_000000a0;
  positionTy *in_stack_000000a8;
  reference in_stack_ffffffffffffff90;
  __normal_iterator<RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_> local_60;
  pointer *local_58;
  boundingBoxTy *in_stack_ffffffffffffffd0;
  XPLMProbeRef *in_stack_ffffffffffffffd8;
  RwyEndPt *in_stack_ffffffffffffffe0;
  
  boundingBoxTy::center(in_stack_ffffffffffffffd0);
  pRVar2 = (pointer)YProbe_at_m(in_stack_000000a8,in_stack_000000a0);
  in_RDI[7].super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>._M_impl.super__Vector_impl_data.
  _M_finish = pRVar2;
  local_58 = &in_RDI[8].super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_60._M_current = (RwyEndPt *)std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::begin(in_RDI);
  std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         __gnu_cxx::__normal_iterator<RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
         ::operator*(&local_60);
    RwyEndPt::ComputeAlt(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __gnu_cxx::__normal_iterator<RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>::
    operator++(&local_60);
  }
  return;
}

Assistant:

void UpdateAltitudes ()
    {
        // Airport: Center of boundaries
        alt_m = YProbe_at_m(bounds.center(), YProbe);
        
        // rwy ends
        for (RwyEndPt& re: vecRwyEndPts)            // for all rwy endpoints
            re.ComputeAlt(YProbe);
    }